

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::torrent::name_abi_cxx11_(string *__return_storage_ptr__,torrent *this)

{
  bool bVar1;
  element_type *this_00;
  string *psVar2;
  type pbVar3;
  allocator<char> local_19;
  torrent *local_18;
  torrent *this_local;
  
  local_18 = this;
  this_local = (torrent *)__return_storage_ptr__;
  bVar1 = valid_metadata(this);
  if (bVar1) {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    psVar2 = torrent_info::name_abi_cxx11_(this_00);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_name);
    if (bVar1) {
      pbVar3 = ::std::
               unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&this->m_name);
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar3);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_19);
      ::std::allocator<char>::~allocator(&local_19);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string torrent::name() const
	{
		if (valid_metadata()) return m_torrent_file->name();
		if (m_name) return *m_name;
		return "";
	}